

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,int start,int num,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  string *psVar1;
  ulong uVar2;
  
  if (0 < num) {
    if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
      if ((this->super_RepeatedPtrFieldBase).arena_ == (Arena *)0x0) {
        for (uVar2 = 0; (uint)num != uVar2; uVar2 = uVar2 + 1) {
          elements[uVar2] =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((this->super_RepeatedPtrFieldBase).rep_)->elements[(long)start + uVar2];
        }
      }
      else {
        for (uVar2 = 0; (uint)num != uVar2; uVar2 = uVar2 + 1) {
          psVar1 = internal::StringTypeHandler::New_abi_cxx11_((Arena *)0x0);
          std::__cxx11::string::_M_assign((string *)psVar1);
          elements[uVar2] = psVar1;
        }
      }
    }
    internal::RepeatedPtrFieldBase::CloseGap(&this->super_RepeatedPtrFieldBase,start,num);
    return;
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrange(int start, int num,
                                                       Element** elements) {
  typename internal::TypeImplementsMergeBehavior<
      typename TypeHandler::Type>::type t;
  ExtractSubrangeInternal(start, num, elements, t);
}